

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::UnaryExpr<const_semver::from_chars_result_&>::streamReconstructedExpression
          (UnaryExpr<const_semver::from_chars_result_&> *this,ostream *os)

{
  string local_38;
  ostream *local_18;
  ostream *os_local;
  UnaryExpr<const_semver::from_chars_result_&> *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  Detail::stringify<semver::from_chars_result>(&local_38,this->m_lhs);
  std::operator<<(os,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }